

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

void __thiscall QAbstractScrollAreaPrivate::flashScrollBars(QAbstractScrollAreaPrivate *this)

{
  long lVar1;
  int iVar2;
  QStyle *pQVar3;
  long lVar4;
  undefined8 *puVar5;
  QStyleOptionSlider *pQVar6;
  long in_FS_OFFSET;
  QStyleOptionSlider opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = &DAT_005f73a0;
  pQVar6 = &opt;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pQVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    pQVar6 = (QStyleOptionSlider *)((long)pQVar6 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->hbar,&opt);
  pQVar3 = QWidget::style((QWidget *)this->hbar);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x60,&opt,this->hbar,0);
  if ((this->hbarpolicy == ScrollBarAsNeeded) ||
     ((this->hbarpolicy != ScrollBarAlwaysOff && (iVar2 != 0)))) {
    QScrollBarPrivate::flash
              (*(QScrollBarPrivate **)&(this->hbar->super_QAbstractSlider).super_QWidget.field_0x8);
  }
  (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->vbar,&opt);
  pQVar3 = QWidget::style((QWidget *)this->vbar);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x60,&opt,this->vbar,0);
  if ((this->vbarpolicy == ScrollBarAsNeeded) ||
     ((this->vbarpolicy != ScrollBarAlwaysOff && (iVar2 != 0)))) {
    QScrollBarPrivate::flash
              (*(QScrollBarPrivate **)&(this->vbar->super_QAbstractSlider).super_QWidget.field_0x8);
  }
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::flashScrollBars()
{
    QStyleOptionSlider opt;
    hbar->initStyleOption(&opt);

    bool htransient = hbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, hbar);
    if ((hbarpolicy != Qt::ScrollBarAlwaysOff) && (hbarpolicy == Qt::ScrollBarAsNeeded || htransient))
        hbar->d_func()->flash();
    vbar->initStyleOption(&opt);
    bool vtransient = vbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, vbar);
    if ((vbarpolicy != Qt::ScrollBarAlwaysOff) && (vbarpolicy == Qt::ScrollBarAsNeeded || vtransient))
        vbar->d_func()->flash();
}